

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classviewer.cpp
# Opt level: O0

char * getFormattedConstant(cp_info *constantPool,u2 index)

{
  CONSTANT_Long_info CVar1;
  u1 *puVar2;
  undefined2 uVar3;
  undefined2 index_00;
  uint uVar4;
  int iVar5;
  cp_info *pcVar6;
  ostream *poVar7;
  char *__s;
  char *__s_00;
  size_t sVar8;
  size_t sVar9;
  __type_conflict _Var10;
  ulong local_650;
  uint local_63c;
  ushort local_5ec;
  ushort local_5ea;
  uint16_t i;
  uint16_t j;
  char *str_3;
  CONSTANT_Utf8_info utf8_info;
  char *result;
  char *descriptor;
  char *name_3;
  CONSTANT_NameAndType_info nameAndTypeInfo_3;
  char *str_2;
  double number_3;
  int64_t m_1;
  int32_t e_1;
  int32_t s_2;
  int64_t bytes;
  CONSTANT_Double_info doubleInfo;
  char *str_1;
  int64_t number_2;
  CONSTANT_Long_info longInfo;
  char *str;
  float number_1;
  int32_t m;
  int32_t e;
  int32_t s_1;
  CONSTANT_Float_info floatInfo;
  char *s;
  int32_t number;
  CONSTANT_Integer_info intInfo;
  CONSTANT_String_info stringInfo;
  stringstream ss_2;
  ostream local_520 [376];
  char *local_3a8;
  char *name_2;
  char *className_2;
  CONSTANT_NameAndType_info nameAndTypeInfo_2;
  CONSTANT_InterfaceMethodref_info interfaceMethodRefInfo;
  stringstream ss_1;
  ostream local_380 [376];
  char *local_208;
  char *name_1;
  char *className_1;
  undefined1 local_1f0 [4];
  CONSTANT_NameAndType_info nameAndTypeInfo_1;
  CONSTANT_Methodref_info methodRefInfo;
  stringstream local_1e0 [8];
  stringstream ss;
  ostream local_1d0 [376];
  char *local_58;
  char *name;
  char *className;
  undefined1 local_40 [4];
  CONSTANT_NameAndType_info nameAndTypeInfo;
  CONSTANT_Fieldref_info fieldRefInfo;
  CONSTANT_Class_info classInfo;
  cp_info constant;
  u2 index_local;
  cp_info *constantPool_local;
  
  pcVar6 = constantPool + (int)(index - 1);
  CVar1 = (pcVar6->info).long_info;
  puVar2 = (pcVar6->info).utf8_info.bytes;
  fieldRefInfo.class_index._0_1_ = (uchar)*(undefined8 *)pcVar6;
  constant._0_2_ = CVar1.high_bytes._0_2_;
  index_00 = constant._0_2_;
  if ((uchar)fieldRefInfo.class_index == '\a') {
    nameAndTypeInfo.descriptor_index = constant._0_2_;
    constantPool_local = (cp_info *)getFormattedConstant(constantPool,constant._0_2_);
  }
  else {
    constant._0_4_ = CVar1.high_bytes;
    local_40._2_2_ = CVar1.high_bytes._2_2_;
    uVar3 = local_40._2_2_;
    if ((uchar)fieldRefInfo.class_index == '\t') {
      local_40 = (undefined1  [4])constant._0_4_;
      className._4_4_ = constantPool[(ulong)(ushort)uVar3 - 1].info.fieldref_info;
      name = getFormattedConstant(constantPool,index_00);
      local_58 = getFormattedConstant(constantPool,className._4_2_);
      std::__cxx11::stringstream::stringstream(local_1e0);
      poVar7 = std::operator<<(local_1d0,name);
      poVar7 = std::operator<<(poVar7,".");
      std::operator<<(poVar7,local_58);
      constantPool_local = (cp_info *)Utils::streamToCString((stringstream *)local_1e0);
      std::__cxx11::stringstream::~stringstream(local_1e0);
    }
    else if ((uchar)fieldRefInfo.class_index == '\n') {
      local_1f0 = (undefined1  [4])constant._0_4_;
      className_1._4_4_ = constantPool[(ulong)(ushort)local_40._2_2_ - 1].info.fieldref_info;
      name_1 = getFormattedConstant(constantPool,index_00);
      local_208 = getFormattedConstant(constantPool,className_1._4_2_);
      std::__cxx11::stringstream::stringstream((stringstream *)&nameAndTypeInfo_2);
      poVar7 = std::operator<<(local_380,name_1);
      poVar7 = std::operator<<(poVar7,".");
      std::operator<<(poVar7,local_208);
      constantPool_local = (cp_info *)Utils::streamToCString((stringstream *)&nameAndTypeInfo_2);
      std::__cxx11::stringstream::~stringstream((stringstream *)&nameAndTypeInfo_2);
    }
    else if ((uchar)fieldRefInfo.class_index == '\v') {
      className_2._4_1_ = constant.tag;
      className_2._5_3_ = constant._1_3_;
      className_2._0_4_ = constantPool[(ulong)(ushort)local_40._2_2_ - 1].info.fieldref_info;
      name_2 = getFormattedConstant(constantPool,index_00);
      local_3a8 = getFormattedConstant(constantPool,(u2)className_2);
      std::__cxx11::stringstream::stringstream((stringstream *)&intInfo);
      poVar7 = std::operator<<(local_520,name_2);
      poVar7 = std::operator<<(poVar7,".");
      std::operator<<(poVar7,local_3a8);
      constantPool_local = (cp_info *)Utils::streamToCString((stringstream *)&intInfo);
      std::__cxx11::stringstream::~stringstream((stringstream *)&intInfo);
    }
    else if ((uchar)fieldRefInfo.class_index == '\b') {
      constantPool_local = (cp_info *)getFormattedConstant(constantPool,index_00);
    }
    else if ((uchar)fieldRefInfo.class_index == '\x03') {
      constantPool_local = (cp_info *)malloc(100);
      sprintf((char *)constantPool_local,"%d",(ulong)CVar1 & 0xffffffff);
    }
    else if ((uchar)fieldRefInfo.class_index == '\x04') {
      iVar5 = -1;
      if (-1 < (int)constant._0_4_) {
        iVar5 = 1;
      }
      uVar4 = (uint)constant._0_4_ >> 0x17 & 0xff;
      if (uVar4 == 0) {
        local_63c = (constant._0_4_ & 0x7fffff) << 1;
      }
      else {
        local_63c = constant._0_4_ & 0x7fffff | 0x800000;
      }
      _Var10 = std::pow<int,int>(2,uVar4 - 0x96);
      constantPool_local = (cp_info *)malloc(100);
      sprintf((char *)constantPool_local,"%f",
              (double)(float)((double)(int)(iVar5 * local_63c) * _Var10));
    }
    else {
      number_2._4_4_ = CVar1.low_bytes;
      if ((uchar)fieldRefInfo.class_index == '\x05') {
        constantPool_local = (cp_info *)malloc(100);
        sprintf((char *)constantPool_local,"%lld",CONCAT44(constant._0_4_,number_2._4_4_));
      }
      else if ((uchar)fieldRefInfo.class_index == '\x06') {
        iVar5 = -1;
        if (-1 < (int)constant._0_4_) {
          iVar5 = 1;
        }
        uVar4 = (int)constant._0_4_ >> 0x14 & 0x7ff;
        if (uVar4 == 0) {
          local_650 = (CONCAT44(constant._0_4_,number_2._4_4_) & 0xfffffffffffff) << 1;
        }
        else {
          local_650 = CONCAT44(constant._0_4_,number_2._4_4_) & 0xfffffffffffff | 0x10000000000000;
        }
        _Var10 = std::pow<int,int>(2,uVar4 - 0x433);
        constantPool_local = (cp_info *)malloc(100);
        sprintf((char *)constantPool_local,"%f",(double)(long)((long)iVar5 * local_650) * _Var10);
      }
      else if ((uchar)fieldRefInfo.class_index == '\f') {
        __s = getFormattedConstant(constantPool,index_00);
        __s_00 = getFormattedConstant(constantPool,local_40._2_2_);
        sVar8 = strlen(__s);
        sVar9 = strlen(__s_00);
        constantPool_local = (cp_info *)malloc(sVar8 + sVar9 + 1);
        strcpy((char *)constantPool_local,__s);
        strcat((char *)constantPool_local,__s_00);
      }
      else {
        if ((uchar)fieldRefInfo.class_index != '\x01') {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Arquivo .class possui uma tag ");
          poVar7 = std::operator<<(poVar7,(uchar)fieldRefInfo.class_index);
          poVar7 = std::operator<<(poVar7," invalida no pool de constantes.");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          exit(5);
        }
        constantPool_local = (cp_info *)malloc((long)(int)((ushort)index_00 + 1));
        local_5ea = 0;
        for (local_5ec = 0; local_5ec < (ushort)index_00; local_5ec = local_5ec + 1) {
          iVar5 = isprint((uint)puVar2[local_5ec]);
          if (iVar5 != 0) {
            (&constantPool_local->tag)[local_5ea] = puVar2[local_5ec];
            local_5ea = local_5ea + 1;
          }
        }
        (&constantPool_local->tag)[local_5ea] = '\0';
      }
    }
  }
  return (char *)constantPool_local;
}

Assistant:

const char* getFormattedConstant(cp_info* constantPool, u2 index) {
    cp_info constant = constantPool[index-1];
    
    if (constant.tag == CONSTANT_Class) {
        CONSTANT_Class_info classInfo = constant.info.class_info;
        return getFormattedConstant(constantPool, classInfo.name_index);
    } else if (constant.tag == CONSTANT_Fieldref) {
        CONSTANT_Fieldref_info fieldRefInfo = constant.info.fieldref_info;
        CONSTANT_NameAndType_info nameAndTypeInfo = constantPool[fieldRefInfo.name_and_type_index-1].info.nameAndType_info;
        
        const char *className = getFormattedConstant(constantPool, fieldRefInfo.class_index);
        const char *name = getFormattedConstant(constantPool, nameAndTypeInfo.name_index);
        
        stringstream ss;
        ss << className << "." << name;
        return Utils::streamToCString(ss);
    } else if (constant.tag == CONSTANT_Methodref) {
        CONSTANT_Methodref_info methodRefInfo = constant.info.methodref_info;
        CONSTANT_NameAndType_info nameAndTypeInfo = constantPool[methodRefInfo.name_and_type_index-1].info.nameAndType_info;
        
        const char *className = getFormattedConstant(constantPool, methodRefInfo.class_index);
        const char *name = getFormattedConstant(constantPool, nameAndTypeInfo.name_index);
        
        stringstream ss;
        ss << className << "." << name;
        return Utils::streamToCString(ss);
    } else if (constant.tag == CONSTANT_InterfaceMethodref) {
        CONSTANT_InterfaceMethodref_info interfaceMethodRefInfo = constant.info.interfaceMethodref_info;
        CONSTANT_NameAndType_info nameAndTypeInfo = constantPool[interfaceMethodRefInfo.name_and_type_index-1].info.nameAndType_info;
        
        const char *className = getFormattedConstant(constantPool, interfaceMethodRefInfo.class_index);
        const char *name = getFormattedConstant(constantPool, nameAndTypeInfo.name_index);
        
        stringstream ss;
        ss << className << "." << name;
        return Utils::streamToCString(ss);
    } else if (constant.tag == CONSTANT_String) {
        CONSTANT_String_info stringInfo = constant.info.string_info;
        return getFormattedConstant(constantPool, stringInfo.string_index);
    } else if (constant.tag == CONSTANT_Integer) {
        CONSTANT_Integer_info intInfo = constant.info.integer_info;
        int32_t number = intInfo.bytes;
        char *s = (char*) malloc(sizeof(char)*100);
        sprintf(s, "%d", number);
        return s;
    } else if (constant.tag == CONSTANT_Float) {
        CONSTANT_Float_info floatInfo = constant.info.float_info;
        
        int32_t s = ((floatInfo.bytes >> 31) == 0) ? 1 : -1;
        int32_t e = ((floatInfo.bytes >> 23) & 0xff);
        int32_t m = (e == 0) ? (floatInfo.bytes & 0x7fffff) << 1 : (floatInfo.bytes & 0x7fffff) | 0x800000;
        float number = s * m * pow(2, e-150);
        
        char *str = (char*) malloc(sizeof(char)*100);
        sprintf(str, "%f", number);
        return str;
    } else if (constant.tag == CONSTANT_Long) {
        CONSTANT_Long_info longInfo = constant.info.long_info;
        int64_t number = ((int64_t) longInfo.high_bytes << 32) + longInfo.low_bytes;
        
        char *str = (char*) malloc(sizeof(char)*100);
        sprintf(str, "%lld", number);
        return str;
    } else if (constant.tag == CONSTANT_Double) {
        CONSTANT_Double_info doubleInfo = constant.info.double_info;
        int64_t bytes = ((int64_t) doubleInfo.high_bytes << 32) + doubleInfo.low_bytes;
        
        int32_t s = ((bytes >> 63) == 0) ? 1 : -1;
        int32_t e = (int32_t)((bytes >> 52) & 0x7ffL);
        int64_t m = (e == 0) ? (bytes & 0xfffffffffffffL) << 1 : (bytes & 0xfffffffffffffL) | 0x10000000000000L;
        double number = s * m * pow(2, e-1075);
        
        char *str = (char*) malloc(sizeof(char)*100);
        sprintf(str, "%f", number);
        return str;
    } else if (constant.tag == CONSTANT_NameAndType) {
        CONSTANT_NameAndType_info nameAndTypeInfo = constant.info.nameAndType_info;
        
        const char *name = getFormattedConstant(constantPool, nameAndTypeInfo.name_index);
        const char *descriptor = getFormattedConstant(constantPool, nameAndTypeInfo.descriptor_index);
        
        char *result = (char*) malloc(sizeof(char)*(strlen(name)+strlen(descriptor)) + 1);
        strcpy(result, name);
        strcat(result, descriptor);
        
        return result;
    } else if (constant.tag == CONSTANT_Utf8) {
        CONSTANT_Utf8_info utf8_info = constant.info.utf8_info;
        char *str = (char*) malloc((utf8_info.length + 1) * sizeof(char));
        
        uint16_t j = 0;
        for (uint16_t i = 0; i < utf8_info.length; i++) {
            if (isprint(utf8_info.bytes[i])) str[j++] = utf8_info.bytes[i];
        }
        str[j] = '\0';
        
        return str;
    } else {
        cerr << "Arquivo .class possui uma tag " << constant.tag << " invalida no pool de constantes." << endl;
        exit(5);
    }
    
    return NULL;
}